

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::yflip(ImageT<unsigned_char,_1U> *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Color *pCVar4;
  Color *pCVar5;
  color<unsigned_char,_1U> *__dest;
  ImageT<unsigned_char,_1U> *in_RDI;
  ulong uVar6;
  Color *dstRow;
  Color *srcRow;
  uint32_t dy;
  uint32_t sy;
  Color *rowBuffer;
  uint32_t rowSize;
  color<unsigned_char,_1U> *local_60;
  int local_2c;
  uint local_28;
  
  uVar1 = (in_RDI->super_Image).width;
  uVar6 = (ulong)(in_RDI->super_Image).width;
  __dest = (color<unsigned_char,_1U> *)operator_new__(uVar6);
  if (uVar6 != 0) {
    local_60 = __dest;
    do {
      color<unsigned_char,_1U>::color(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __dest + uVar6);
  }
  local_28 = (in_RDI->super_Image).height;
  local_2c = 0;
  while (local_28 = local_28 - 1, (in_RDI->super_Image).height >> 1 <= local_28) {
    pCVar4 = in_RDI->pixels;
    uVar2 = (in_RDI->super_Image).width;
    pCVar5 = in_RDI->pixels;
    uVar3 = (in_RDI->super_Image).width;
    memcpy(__dest,pCVar5 + uVar3 * local_2c,(ulong)uVar1);
    memcpy(pCVar5 + uVar3 * local_2c,pCVar4 + uVar2 * local_28,(ulong)uVar1);
    memcpy(pCVar4 + uVar2 * local_28,__dest,(ulong)uVar1);
    local_2c = local_2c + 1;
  }
  if (__dest != (color<unsigned_char,_1U> *)0x0) {
    operator_delete__(__dest);
  }
  return in_RDI;
}

Assistant:

virtual ImageT& yflip() override {
        uint32_t rowSize = width * sizeof(Color);
        // Minimize memory use by only buffering a single row.
        Color* rowBuffer = new Color[width];

        for (uint32_t sy = height-1, dy = 0; sy >= height / 2; sy--, dy++) {
            Color* srcRow = &pixels[width * sy];
            Color* dstRow = &pixels[width * dy];

            memcpy(rowBuffer, dstRow, rowSize);
            memcpy(dstRow, srcRow, rowSize);
            memcpy(srcRow, rowBuffer, rowSize);
        }
        delete[] rowBuffer;
        return *this;
    }